

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_str_t * adt_str_clone(adt_str_t *other)

{
  adt_error_t aVar1;
  adt_str_t *paStack_18;
  adt_error_t result;
  adt_str_t *self;
  adt_str_t *other_local;
  
  paStack_18 = (adt_str_t *)0x0;
  if (((other != (adt_str_t *)0x0) && (paStack_18 = adt_str_new(), paStack_18 != (adt_str_t *)0x0))
     && (aVar1 = adt_str_set(paStack_18,other), aVar1 != '\0')) {
    adt_str_delete(paStack_18);
    paStack_18 = (adt_str_t *)0x0;
  }
  return paStack_18;
}

Assistant:

adt_str_t *adt_str_clone(const adt_str_t* other)
{
   adt_str_t *self = (adt_str_t*) 0;
   if (other != 0)
   {
      self = adt_str_new();
      if (self != 0)
      {
         adt_error_t result = adt_str_set(self, other);
         if (result != ADT_NO_ERROR)
         {
            adt_str_delete(self);
            self = (adt_str_t*) 0;
         }
      }
   }
   return self;
}